

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O3

int done_in_by_format(monst *mtmp,char *buf)

{
  short sVar1;
  uint uVar2;
  bool bVar3;
  boolean bVar4;
  int iVar5;
  obj *poVar6;
  size_t sVar7;
  permonst *ppVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  
  bVar3 = true;
  if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
     ((u.umonnum == u.umonster || (bVar4 = dmgtype(youmonst.data,0x24), bVar4 == '\0')))) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00195386;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00195329;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00195320;
      }
      else {
LAB_00195320:
        if (ublindf == (obj *)0x0) goto LAB_001953d5;
LAB_00195329:
        if (ublindf->oartifact != '\x1d') goto LAB_001953d5;
      }
      if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
           (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)
          ) && ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_00195386;
LAB_001953d5:
      if (((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
          (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00195426;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00195421;
        }
        else {
LAB_00195421:
          if (ublindf != (obj *)0x0) {
LAB_00195426:
            if (ublindf->oartifact == '\x1d') goto LAB_001954b5;
          }
          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_0019550d;
        }
LAB_001954b5:
        if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_001954f5;
        iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
        bVar3 = false;
        if ((iVar5 < 0x41) || (bVar3 = false, u.uprops[0x42].intrinsic != 0)) goto LAB_00195510;
      }
      else {
LAB_001954f5:
        if (u.uprops[0x42].intrinsic != 0) goto LAB_0019550d;
      }
      if (u.uprops[0x42].extrinsic == 0) {
        bVar4 = match_warn_of_mon(mtmp);
        bVar3 = bVar4 == '\0';
        goto LAB_00195510;
      }
    }
    else {
      bVar4 = worm_known(level,mtmp);
      if (bVar4 == '\0') goto LAB_001953d5;
LAB_00195386:
      uVar2 = *(uint *)&mtmp->field_0x60;
      if ((((uVar2 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0))
      {
        if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_001953c7;
        goto LAB_001953d5;
      }
      if ((uVar2 & 0x280) != 0) goto LAB_001953d5;
LAB_001953c7:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_001953d5;
    }
LAB_0019550d:
    bVar3 = false;
  }
LAB_00195510:
  *buf = '\0';
  ppVar8 = mtmp->data;
  iVar5 = 0;
  if ((ppVar8->geno & 0x1000) == 0) {
LAB_0019555c:
    if ((ppVar8 == mons + 0x12a) && (mtmp->mnamelth != '\0')) {
      sVar7 = strlen(buf);
      builtin_strncpy(buf + sVar7,"the ",5);
      iVar5 = 1;
    }
  }
  else if ((ppVar8 != mons + 0x120) || (iVar5 = 0, (mtmp->field_0x63 & 0x10) != 0)) {
    iVar5 = 1;
    if ((ppVar8->mflags2 & 0x80000) == 0) {
      sVar7 = strlen(buf);
      builtin_strncpy(buf + sVar7,"the ",5);
      ppVar8 = mtmp->data;
    }
    goto LAB_0019555c;
  }
  if ((mtmp->field_0x60 & 2) != 0) {
    sVar7 = strlen(buf);
    builtin_strncpy(buf + sVar7,"invisible ",0xb);
  }
  if (!bVar3) {
    sVar7 = strlen(buf);
    builtin_strncpy(buf + sVar7,"hallucinogen-distorted ",0x18);
  }
  if (mtmp->data == mons + 0x12a) {
    sVar7 = strlen(buf);
    builtin_strncpy(buf + sVar7,"ghost",6);
    if (mtmp->mnamelth == '\0') goto LAB_001956df;
    pcVar9 = eos(buf);
    sVar1 = mtmp->mxlth;
    pcVar11 = " of %s";
  }
  else {
    if ((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) != 0) {
      pcVar9 = eos(buf);
      pcVar11 = "Ms.";
      if ((mtmp->field_0x60 & 1) == 0) {
        pcVar11 = "Mr.";
      }
      pcVar10 = shkname(mtmp);
      sprintf(pcVar9,"%s %s, the shopkeeper",pcVar11,pcVar10);
      iVar5 = 1;
      goto LAB_001956df;
    }
    if ((*(uint *)&mtmp->field_0x60 & 0x14000000) != 0) {
      pcVar9 = m_monnam(mtmp);
      strcat(buf,pcVar9);
      goto LAB_001956df;
    }
    pcVar9 = mons_mname(mtmp->data);
    strcat(buf,pcVar9);
    if (mtmp->mnamelth == '\0') goto LAB_001956df;
    pcVar9 = eos(buf);
    sVar1 = mtmp->mxlth;
    pcVar11 = " called %s";
  }
  sprintf(pcVar9,pcVar11,(undefined1 *)((long)(mtmp->mtrack + 0x18) + (long)sVar1));
LAB_001956df:
  if (multi != 0) {
    if (multi_txt[0] == '\0') {
      sVar7 = strlen(buf);
      builtin_strncpy(buf + sVar7,", while helpless",0x11);
    }
    else {
      pcVar9 = eos(buf);
      sprintf(pcVar9,", while %s",multi_txt);
    }
  }
  return iVar5;
}

Assistant:

int done_in_by_format(const struct monst *mtmp, char *buf)
{
	int kfmt;
	boolean distorted = (boolean)(Hallucination && canspotmon(level, mtmp));

	buf[0] = '\0';
	kfmt = KILLED_BY_AN;
	/* "killed by the high priest of Crom" is okay, "killed by the high
	   priest" alone isn't */
	if ((mtmp->data->geno & G_UNIQ) != 0 && !(mtmp->data == &mons[PM_HIGH_PRIEST] && !mtmp->ispriest)) {
	    if (!type_is_pname(mtmp->data))
		strcat(buf, "the ");
	    kfmt = KILLED_BY;
	}
	/* _the_ <invisible> <distorted> ghost of Dudley */
	if (mtmp->data == &mons[PM_GHOST] && mtmp->mnamelth) {
		strcat(buf, "the ");
		kfmt = KILLED_BY;
	}
	if (mtmp->minvis)
		strcat(buf, "invisible ");
	if (distorted)
		strcat(buf, "hallucinogen-distorted ");

	if (mtmp->data == &mons[PM_GHOST]) {
		strcat(buf, "ghost");
		if (mtmp->mnamelth) sprintf(eos(buf), " of %s", NAME(mtmp));
	} else if (mtmp->isshk) {
		sprintf(eos(buf), "%s %s, the shopkeeper",
			(mtmp->female ? "Ms." : "Mr."), shkname(mtmp));
		kfmt = KILLED_BY;
	} else if (mtmp->ispriest || mtmp->isminion) {
		/* m_monnam() suppresses "the" prefix plus "invisible", and
		   it overrides the effect of Hallucination on priestname() */
		const char *killer_mon = m_monnam(mtmp);
		strcat(buf, killer_mon);
	} else {
		strcat(buf, mons_mname(mtmp->data));
		if (mtmp->mnamelth)
		    sprintf(eos(buf), " called %s", NAME(mtmp));
	}

	if (multi) {
	    if (*multi_txt)
		sprintf(eos(buf), ", while %s", multi_txt);
	    else
		strcat(buf, ", while helpless");
	}

	return kfmt;
}